

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O1

bool __thiscall HACD::TMMesh::Normalize(TMMesh *this)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 in_XMM11 [16];
  
  sVar2 = (this->m_vertices).m_size;
  if (sVar2 != 0) {
    pCVar5 = (this->m_vertices).m_head;
    dVar8 = (pCVar5->m_data).m_pos.m_data[0];
    (this->m_barycenter).m_data[0] = dVar8;
    dVar10 = (pCVar5->m_data).m_pos.m_data[1];
    (this->m_barycenter).m_data[1] = dVar10;
    dVar12 = (pCVar5->m_data).m_pos.m_data[2];
    (this->m_barycenter).m_data[2] = dVar12;
    dVar17 = dVar12;
    dVar14 = dVar8;
    dVar16 = dVar10;
    if (sVar2 != 1) {
      dVar18 = (this->m_barycenter).m_data[1];
      dVar7 = (this->m_barycenter).m_data[0];
      pCVar5 = (this->m_vertices).m_head;
      lVar6 = sVar2 - 1;
      dVar19 = dVar12;
      dVar11 = dVar12;
      do {
        dVar7 = dVar7 + (pCVar5->m_data).m_pos.m_data[0];
        (this->m_barycenter).m_data[0] = dVar7;
        dVar18 = dVar18 + (pCVar5->m_data).m_pos.m_data[1];
        (this->m_barycenter).m_data[1] = dVar18;
        dVar19 = dVar19 + (pCVar5->m_data).m_pos.m_data[2];
        (this->m_barycenter).m_data[2] = dVar19;
        dVar12 = (pCVar5->m_data).m_pos.m_data[0];
        dVar1 = dVar12;
        if ((dVar8 <= dVar12) && (dVar1 = dVar8, dVar14 < dVar12)) {
          dVar14 = dVar12;
        }
        dVar8 = dVar1;
        dVar12 = (pCVar5->m_data).m_pos.m_data[1];
        dVar1 = (pCVar5->m_data).m_pos.m_data[2];
        dVar4 = dVar12;
        if ((dVar10 <= dVar12) && (dVar4 = dVar10, dVar16 < dVar12)) {
          dVar16 = dVar12;
        }
        dVar10 = dVar4;
        dVar12 = dVar1;
        if ((dVar11 <= dVar1) && (dVar12 = dVar11, dVar17 < dVar1)) {
          dVar17 = dVar1;
        }
        pCVar5 = pCVar5->m_next;
        (this->m_vertices).m_head = pCVar5;
        lVar6 = lVar6 + -1;
        dVar11 = dVar12;
      } while (lVar6 != 0);
    }
    auVar9 = vcvtusi2sd_avx512f(in_XMM11,sVar2);
    dVar18 = (this->m_barycenter).m_data[1];
    dVar7 = auVar9._0_8_;
    (this->m_barycenter).m_data[0] = (this->m_barycenter).m_data[0] / dVar7;
    (this->m_barycenter).m_data[1] = dVar18 / dVar7;
    (this->m_barycenter).m_data[2] = (this->m_barycenter).m_data[2] / dVar7;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (dVar16 - dVar10) * (dVar16 - dVar10);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar14 - dVar8;
    auVar9 = vfmadd231sd_fma(auVar9,auVar15,auVar15);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar17 - dVar12;
    auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
    if (auVar9._0_8_ < 0.0) {
      dVar8 = sqrt(auVar9._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar8 = auVar9._0_8_;
    }
    dVar8 = dVar8 * 0.001;
    this->m_diag = dVar8;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = 1.0 / dVar8;
      pCVar5 = (this->m_vertices).m_head;
      sVar3 = (this->m_vertices).m_size;
      lVar6 = sVar2 + (sVar2 == 0);
      do {
        dVar10 = (pCVar5->m_data).m_pos.m_data[1];
        dVar12 = (this->m_barycenter).m_data[1];
        dVar17 = (pCVar5->m_data).m_pos.m_data[2];
        dVar14 = (this->m_barycenter).m_data[2];
        (pCVar5->m_data).m_pos.m_data[0] =
             dVar8 * ((pCVar5->m_data).m_pos.m_data[0] - (this->m_barycenter).m_data[0]);
        (pCVar5->m_data).m_pos.m_data[1] = dVar8 * (dVar10 - dVar12);
        (pCVar5->m_data).m_pos.m_data[2] = dVar8 * (dVar17 - dVar14);
        if (sVar3 != 0) {
          pCVar5 = pCVar5->m_next;
          (this->m_vertices).m_head = pCVar5;
        }
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  return sVar2 != 0;
}

Assistant:

void TMMEdge::Initialize()
	{
        m_id = 0;
		m_triangles[0] = m_triangles[1] = m_newFace = 0;
		m_vertices[0] = m_vertices[1] = 0;
    }